

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void point_based_points(game_event_type type,game_event_data *data,void *user)

{
  wchar_t wVar1;
  char *pcVar2;
  char *str;
  char *pcVar3;
  wchar_t remaining;
  int *inc;
  int *spent;
  wchar_t sum;
  wchar_t i;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  spent._0_4_ = 0;
  pcVar3 = data->string;
  pcVar2 = (data->birthstage).hint;
  wVar1 = (data->birthstage).n_choices;
  put_str("Cost",L'\x01',L'J');
  for (spent._4_4_ = 0; spent._4_4_ < 5; spent._4_4_ = spent._4_4_ + 1) {
    buysell[spent._4_4_] = 0;
    if (0 < *(int *)(pcVar3 + (long)spent._4_4_ * 4)) {
      buysell[spent._4_4_] = buysell[spent._4_4_] | 1;
    }
    if (*(wchar_t *)(pcVar2 + (long)spent._4_4_ * 4) <= wVar1) {
      buysell[spent._4_4_] = buysell[spent._4_4_] | 2;
    }
    str = format("%4d",(ulong)*(uint *)(pcVar3 + (long)spent._4_4_ * 4));
    put_str(str,spent._4_4_ + L'\x02',L'J');
    spent._0_4_ = *(int *)(pcVar3 + (long)spent._4_4_ * 4) + (uint)spent;
  }
  pcVar3 = format("Total Cost: %2d/%2d",(ulong)(uint)spent,(ulong)(uint)(wVar1 + (uint)spent));
  put_str(pcVar3,L'\a',L'=');
  return;
}

Assistant:

static void point_based_points(game_event_type type, game_event_data *data,
							   void *user)
{
	int i;
	int sum = 0;
	const int *spent = data->birthpoints.points;
	const int *inc = data->birthpoints.inc_points;
	int remaining = data->birthpoints.remaining;

	/* Display the costs header */
	put_str("Cost", COSTS_ROW - 1, COSTS_COL);
	
	for (i = 0; i < STAT_MAX; i++) {
		/* Remember what's allowed. */
		buysell[i] = 0;
		if (spent[i] > 0) {
			buysell[i] |= 1;
		}
		if (inc[i] <= remaining) {
			buysell[i] |= 2;
		}
		/* Display cost */
		put_str(format("%4d", spent[i]), COSTS_ROW + i, COSTS_COL);
		sum += spent[i];
	}
	
	put_str(format("Total Cost: %2d/%2d", sum, remaining + sum),
		COSTS_ROW + STAT_MAX, TOTAL_COL);
}